

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArray<float,_false,_false>::DirectGetItem
          (TypedArray<float,_false,_false> *this,uint32 index)

{
  Var pvVar1;
  uint32 index_local;
  TypedArray<float,_false,_false> *this_local;
  
  pvVar1 = TypedDirectGetItemWithCheck(this,index);
  return pvVar1;
}

Assistant:

Var Float32Array::DirectGetItem(__in uint32 index)
    {
        return TypedDirectGetItemWithCheck(index);
    }